

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O3

int SharpYuvConvertWithOptions
              (void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,int rgb_bit_depth,
              void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,int v_stride,
              int yuv_bit_depth,int width,int height,SharpYuvOptions *options)

{
  fixed_y_t *dst;
  SharpYuvTransferFunctionType transfer_type;
  SharpYuvConversionMatrix *pSVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  fixed_y_t *dst_00;
  uint16_t *__ptr;
  uint16_t *__ptr_00;
  uint16_t *__ptr_01;
  int16_t *__ptr_02;
  fixed_t *__ptr_03;
  fixed_t *dst_01;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  ushort uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  uint64_t total_size_1;
  size_t sVar25;
  int16_t *piVar26;
  long lVar27;
  uint16_t *puVar28;
  int iVar29;
  ulong uVar30;
  uint16_t *puVar31;
  ulong uVar32;
  ulong uVar33;
  int16_t *piVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  short sVar40;
  uint uVar41;
  undefined2 uVar42;
  short sVar43;
  uint uVar44;
  uint64_t total_size;
  long lVar45;
  ulong uVar46;
  int i_1;
  uint uVar47;
  size_t sVar48;
  ulong uVar49;
  int16_t *piVar50;
  int iVar51;
  uint uVar52;
  ulong uVar53;
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int bit_depth;
  int yuv_max;
  fixed_t *best_uv_base;
  int uv_h;
  fixed_y_t *src2;
  int len;
  int16_t *local_218;
  fixed_t *local_198;
  void *local_170;
  void *local_168;
  void *local_160;
  int16_t *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  int16_t *local_70;
  uint16_t *local_68;
  ulong local_60;
  fixed_y_t *local_58;
  long local_50;
  fixed_y_t *local_48;
  long local_40;
  long local_38;
  
  iVar51 = 1 << ((byte)rgb_bit_depth - 1 & 0x1f);
  iVar16 = 2;
  if (0xc < rgb_bit_depth) {
    iVar16 = 0xe - rgb_bit_depth;
  }
  local_170 = y_ptr;
  local_160 = u_ptr;
  local_168 = v_ptr;
  auVar55._0_4_ = -(uint)(r_ptr == (void *)0x0);
  auVar55._4_4_ = -(uint)(g_ptr == (void *)0x0);
  auVar55._8_4_ = -(uint)(b_ptr == (void *)0x0);
  auVar55._12_4_ = -(uint)(y_ptr == (void *)0x0);
  iVar37 = movmskps((int)r_ptr,auVar55);
  iVar29 = 0;
  iVar10 = 0;
  if (((((((v_ptr != (void *)0x0 && 0x80000001 < width + 0x80000001U) && u_ptr != (void *)0x0) &&
         0x80000001 < height + 0x80000001U) && iVar37 == 0) &&
       (iVar10 = iVar29, (uint)rgb_bit_depth < 0x11)) &&
      ((0x11500U >> (rgb_bit_depth & 0x1fU) & 1) != 0)) &&
     (((uint)yuv_bit_depth < 0xd && ((0x1500U >> (yuv_bit_depth & 0x1fU) & 1) != 0)))) {
    pSVar1 = options->yuv_matrix;
    transfer_type = options->transfer_type;
    if ((((uint)rgb_bit_depth < 9) || (((rgb_stride | rgb_step) & 1U) == 0)) &&
       (((uint)yuv_bit_depth < 9 || (((u_stride | y_stride | v_stride) & 1U) == 0)))) {
      uVar41 = ~(-1 << ((byte)yuv_bit_depth & 0x1f));
      SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);
      if (rgb_bit_depth == yuv_bit_depth) {
        local_d8 = *(undefined8 *)pSVar1->rgb_to_y;
        uStack_d0 = *(undefined8 *)(pSVar1->rgb_to_y + 2);
        local_c8 = *(undefined8 *)pSVar1->rgb_to_u;
        uStack_c0 = *(undefined8 *)(pSVar1->rgb_to_u + 2);
        local_b8 = *(undefined8 *)pSVar1->rgb_to_v;
        uStack_b0 = *(undefined8 *)(pSVar1->rgb_to_v + 2);
      }
      else {
        uVar24 = ~(-1 << ((byte)rgb_bit_depth & 0x1f));
        lVar22 = 0;
        do {
          *(int *)((long)&local_d8 + lVar22 * 4) =
               (int)(pSVar1->rgb_to_y[lVar22] * uVar41 + iVar51) / (int)uVar24;
          *(int *)((long)&local_c8 + lVar22 * 4) =
               (int)(pSVar1->rgb_to_u[lVar22] * uVar41 + iVar51) / (int)uVar24;
          *(int *)((long)&local_b8 + lVar22 * 4) =
               (int)(pSVar1->rgb_to_v[lVar22] * uVar41 + iVar51) / (int)uVar24;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
      }
      bVar2 = (byte)iVar16;
      bVar4 = -bVar2;
      iVar37 = pSVar1->rgb_to_v[3] >> (bVar4 & 0x1f);
      iVar51 = pSVar1->rgb_to_y[3] >> (bVar4 & 0x1f);
      iVar29 = pSVar1->rgb_to_u[3] >> (bVar4 & 0x1f);
      if (-1 < iVar16) {
        iVar37 = pSVar1->rgb_to_v[3] << (bVar2 & 0x1f);
        iVar51 = pSVar1->rgb_to_y[3] << (bVar2 & 0x1f);
        iVar29 = pSVar1->rgb_to_u[3] << (bVar2 & 0x1f);
      }
      uVar52 = width + 1U & 0x7ffffffe;
      uVar53 = (ulong)uVar52;
      uVar24 = height + 1U & 0x7ffffffe;
      uVar47 = width + 1U >> 1;
      uVar19 = (ulong)uVar47;
      uVar36 = (ulong)(uVar52 * 3);
      dst_00 = (fixed_y_t *)malloc(uVar36 * 4);
      sVar25 = uVar53 * uVar24 * 2;
      __ptr = (uint16_t *)malloc(sVar25);
      __ptr_00 = (uint16_t *)malloc(sVar25);
      __ptr_01 = (uint16_t *)malloc(uVar53 * 4);
      uVar30 = (ulong)(uVar47 * 3);
      sVar25 = uVar24 * uVar30;
      __ptr_02 = (int16_t *)malloc(sVar25);
      __ptr_03 = (fixed_t *)malloc(sVar25);
      sVar25 = uVar30 * 2;
      dst_01 = (fixed_t *)malloc(sVar25);
      auVar56._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
      auVar56._4_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
      auVar56._8_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
      auVar56._12_4_ = -(uint)((int)__ptr_03 == 0 && (int)((ulong)__ptr_03 >> 0x20) == 0);
      iVar6 = movmskps((int)dst_01,auVar56);
      iVar10 = 0;
      if ((((iVar6 == 0) && (iVar10 = 0, __ptr_01 != (uint16_t *)0x0)) &&
          (iVar10 = 0, dst_01 != (fixed_t *)0x0)) && (iVar10 = 0, dst_00 != (fixed_y_t *)0x0)) {
        iVar16 = iVar16 + rgb_bit_depth;
        dVar54 = (double)uVar24 * (double)uVar52 * 3.0;
        uVar11 = (ulong)dVar54;
        dst = dst_00 + uVar36;
        if (height < 1) {
          uVar32 = (ulong)(uVar52 * 2);
          uVar33 = 1;
          if (1 < uVar52) {
            uVar33 = uVar53;
          }
        }
        else {
          uVar32 = (ulong)(uVar52 * 2);
          uVar33 = 1;
          if (1 < uVar52) {
            uVar33 = uVar53;
          }
          iVar10 = rgb_stride * 2;
          uVar13 = (ulong)(uint)((int)uVar33 * 2);
          uVar49 = (ulong)(uVar47 & 0x3fffffff);
          lVar22 = (long)__ptr + uVar32;
          lVar39 = (long)__ptr_00 + uVar32;
          iVar6 = 0;
          puVar28 = __ptr;
          puVar31 = __ptr_00;
          piVar50 = __ptr_02;
          local_198 = __ptr_03;
          do {
            ImportOneRow((uint8_t *)r_ptr,(uint8_t *)g_ptr,(uint8_t *)b_ptr,rgb_step,rgb_bit_depth,
                         width,dst_00);
            if (iVar6 == height + -1) {
              memcpy(dst,dst_00,uVar36 * 2);
            }
            else {
              ImportOneRow((uint8_t *)((long)r_ptr + (long)rgb_stride),
                           (uint8_t *)((long)g_ptr + (long)rgb_stride),
                           (uint8_t *)((long)b_ptr + (long)rgb_stride),rgb_step,rgb_bit_depth,width,
                           dst);
            }
            uVar12 = 0;
            do {
              *(short *)((long)puVar28 + uVar12) =
                   (short)((uint)*(ushort *)((long)dst_00 + uVar12 + uVar32 * 2) * 0x127c +
                           (uint)*(ushort *)((long)dst_00 + uVar12 + uVar32) * 0xb717 +
                           (uint)*(ushort *)((long)dst_00 + uVar12) * 0x366d + 0x8000 >> 0x10);
              uVar12 = uVar12 + 2;
            } while (uVar13 != uVar12);
            uVar12 = 0;
            do {
              *(short *)(lVar22 + uVar12) =
                   (short)((uint)*(ushort *)((long)dst + uVar12 + uVar32 * 2) * 0x127c +
                           (uint)*(ushort *)((long)dst + uVar12 + uVar32) * 0xb717 +
                           (uint)*(ushort *)((long)dst + uVar12) * 0x366d + 0x8000 >> 0x10);
              uVar12 = uVar12 + 2;
            } while (uVar13 != uVar12);
            uVar12 = 0;
            do {
              uVar7 = SharpYuvGammaToLinear
                                (*(uint16_t *)((long)dst_00 + uVar12),iVar16,transfer_type);
              uVar8 = SharpYuvGammaToLinear
                                (*(uint16_t *)((long)dst_00 + uVar12 + uVar32),iVar16,transfer_type)
              ;
              uVar9 = SharpYuvGammaToLinear
                                (*(uint16_t *)((long)dst_00 + uVar12 + uVar32 * 2),iVar16,
                                 transfer_type);
              uVar5 = SharpYuvLinearToGamma
                                ((uint32_t)
                                 ((ulong)uVar9 * 0x127c +
                                  (ulong)uVar8 * 0xb717 + (ulong)uVar7 * 0x366d + 0x8000 >> 0x10),
                                 iVar16,transfer_type);
              *(uint16_t *)((long)puVar31 + uVar12) = uVar5;
              uVar12 = uVar12 + 2;
            } while (uVar13 != uVar12);
            uVar12 = 0;
            do {
              uVar7 = SharpYuvGammaToLinear(*(uint16_t *)((long)dst + uVar12),iVar16,transfer_type);
              uVar8 = SharpYuvGammaToLinear
                                (*(uint16_t *)((long)dst + uVar12 + uVar32),iVar16,transfer_type);
              uVar9 = SharpYuvGammaToLinear
                                (*(uint16_t *)((long)dst + uVar12 + uVar32 * 2),iVar16,transfer_type
                                );
              uVar5 = SharpYuvLinearToGamma
                                ((uint32_t)
                                 ((ulong)uVar9 * 0x127c +
                                  (ulong)uVar8 * 0xb717 + (ulong)uVar7 * 0x366d + 0x8000 >> 0x10),
                                 iVar16,transfer_type);
              *(uint16_t *)(lVar39 + uVar12) = uVar5;
              uVar12 = uVar12 + 2;
            } while (uVar13 != uVar12);
            UpdateChroma(dst_00,dst,local_198,uVar47,rgb_bit_depth,transfer_type);
            memcpy(piVar50,local_198,sVar25);
            piVar50 = piVar50 + uVar30;
            local_198 = local_198 + uVar30;
            r_ptr = (void *)((long)r_ptr + (long)iVar10);
            g_ptr = (void *)((long)g_ptr + (long)iVar10);
            b_ptr = (void *)((long)b_ptr + (long)iVar10);
            iVar6 = iVar6 + 2;
            puVar28 = puVar28 + uVar49 * 4;
            lVar22 = lVar22 + uVar49 * 8;
            puVar31 = puVar31 + uVar49 * 4;
            lVar39 = lVar39 + uVar49 * 8;
          } while (iVar6 < height);
        }
        uVar44 = height + 1U >> 1;
        uVar38 = -1 << ((byte)iVar16 & 0x1f);
        uVar20 = ~(ushort)uVar38;
        iVar10 = (int)(uVar52 - 1) >> 1;
        uVar49 = (ulong)(uVar52 * 2);
        local_40 = (long)dst_00 + uVar49;
        local_48 = dst_00 + uVar32;
        local_50 = (long)__ptr_01 + uVar49;
        local_38 = uVar49 + (long)dst;
        local_58 = dst + uVar32;
        uVar13 = (ulong)(uVar47 * 4);
        local_78 = (uVar13 - 2) + uVar36 * 2;
        local_80 = (ulong)(uVar47 * 2) - 2;
        local_88 = uVar13 - 2;
        uVar12 = 0;
        uVar49 = 0xffffffffffffffff;
        local_a0 = uVar19;
        do {
          uVar18 = 0;
          uVar46 = 0;
          piVar26 = __ptr_02;
          puVar31 = __ptr_00;
          piVar50 = __ptr_02;
          puVar28 = __ptr;
          local_218 = __ptr_02;
          local_e0 = __ptr_03;
          local_98 = uVar49;
          local_90 = uVar12;
          do {
            piVar34 = piVar50;
            lVar22 = local_80;
            uVar49 = 0;
            if ((int)uVar18 < (int)(uVar24 - 2)) {
              uVar49 = uVar30;
            }
            piVar50 = piVar34 + uVar49;
            lVar39 = uVar49 * 2 + local_80;
            iVar6 = -3;
            lVar45 = 0;
            lVar27 = 0;
            lVar23 = local_78;
            lVar35 = local_88;
            sVar48 = uVar36 * 2;
            local_70 = piVar26;
            local_68 = puVar31;
            local_60 = uVar46;
            do {
              iVar3 = *(short *)((long)piVar34 + lVar27) * 3;
              uVar17 = (*(short *)((long)local_218 + lVar27) + iVar3 + 2 >> 2) + (uint)*puVar28;
              uVar21 = uVar20;
              if ((int)uVar17 < 0) {
                uVar21 = 0;
              }
              if ((uVar17 & uVar38) == 0) {
                uVar21 = (ushort)uVar17;
              }
              uVar17 = (iVar3 + *(short *)((long)piVar50 + lVar27) + 2 >> 2) + (uint)puVar28[uVar53]
              ;
              uVar15 = uVar20;
              if ((int)uVar17 < 0) {
                uVar15 = 0;
              }
              if ((uVar17 & uVar38) == 0) {
                uVar15 = (ushort)uVar17;
              }
              *(ushort *)((long)dst_00 + lVar45) = uVar21;
              *(ushort *)((long)dst_00 + sVar48) = uVar15;
              (*SharpYuvFilterRow)
                        ((int16_t *)((long)piVar34 + lVar27),(int16_t *)((long)local_218 + lVar27),
                         iVar10,puVar28 + 1,(uint16_t *)((long)dst_00 + lVar45 + 2),iVar16);
              (*SharpYuvFilterRow)
                        ((int16_t *)((long)piVar34 + lVar27),(int16_t *)((long)piVar50 + lVar27),
                         iVar10,puVar28 + uVar53 + 1,(uint16_t *)((long)dst_00 + sVar48 + 2),iVar16)
              ;
              iVar3 = *(short *)((long)piVar34 + lVar27 + lVar22) * 3;
              uVar17 = (*(short *)((long)local_218 + lVar27 + lVar22) + iVar3 + 2 >> 2) +
                       (uint)puVar28[(int)(uVar52 - 1)];
              uVar21 = uVar20;
              if ((int)uVar17 < 0) {
                uVar21 = 0;
              }
              if ((uVar17 & uVar38) == 0) {
                uVar21 = (ushort)uVar17;
              }
              uVar17 = (iVar3 + *(short *)((long)piVar34 + lVar27 + lVar39) + 2 >> 2) +
                       (uint)puVar28[(int)(uVar52 * 2 + -1)];
              uVar15 = uVar20;
              if ((int)uVar17 < 0) {
                uVar15 = 0;
              }
              if ((uVar17 & uVar38) == 0) {
                uVar15 = (ushort)uVar17;
              }
              *(ushort *)((long)dst_00 + lVar35) = uVar21;
              *(ushort *)((long)dst_00 + lVar23) = uVar15;
              lVar27 = lVar27 + (ulong)(uVar47 * 2);
              lVar35 = lVar35 + uVar13;
              lVar45 = lVar45 + uVar13;
              lVar23 = lVar23 + uVar13;
              sVar48 = sVar48 + uVar13;
              iVar6 = iVar6 + 1;
            } while (iVar6 != 0);
            uVar49 = 0;
            do {
              uVar7 = SharpYuvGammaToLinear(dst_00[uVar49],iVar16,transfer_type);
              uVar8 = SharpYuvGammaToLinear
                                (*(uint16_t *)(local_40 + uVar49 * 2),iVar16,transfer_type);
              uVar9 = SharpYuvGammaToLinear(local_48[uVar49],iVar16,transfer_type);
              uVar5 = SharpYuvLinearToGamma
                                ((uint32_t)
                                 ((ulong)uVar9 * 0x127c +
                                  (ulong)uVar8 * 0xb717 + (ulong)uVar7 * 0x366d + 0x8000 >> 0x10),
                                 iVar16,transfer_type);
              __ptr_01[uVar49] = uVar5;
              uVar49 = uVar49 + 1;
            } while (uVar33 != uVar49);
            uVar49 = 0;
            do {
              uVar7 = SharpYuvGammaToLinear(dst[uVar49],iVar16,transfer_type);
              uVar8 = SharpYuvGammaToLinear
                                (*(uint16_t *)(local_38 + uVar49 * 2),iVar16,transfer_type);
              uVar9 = SharpYuvGammaToLinear(local_58[uVar49],iVar16,transfer_type);
              uVar5 = SharpYuvLinearToGamma
                                ((uint32_t)
                                 ((ulong)uVar9 * 0x127c +
                                  (ulong)uVar8 * 0xb717 + (ulong)uVar7 * 0x366d + 0x8000 >> 0x10),
                                 iVar16,transfer_type);
              *(uint16_t *)(local_50 + uVar49 * 2) = uVar5;
              uVar49 = uVar49 + 1;
            } while (uVar33 != uVar49);
            UpdateChroma(dst_00,dst,dst_01,uVar47,rgb_bit_depth,transfer_type);
            puVar31 = local_68;
            uVar14 = (*SharpYuvUpdateY)(local_68,__ptr_01,puVar28,(int)uVar32,iVar16);
            piVar26 = local_70;
            uVar46 = local_60 + uVar14;
            (*SharpYuvUpdateRGB)(local_e0,dst_01,local_70,uVar47 * 3);
            puVar28 = puVar28 + uVar32;
            piVar26 = piVar26 + uVar30;
            puVar31 = puVar31 + uVar32;
            local_e0 = local_e0 + uVar30;
            uVar18 = uVar18 + 2;
            local_218 = piVar34;
          } while (uVar18 < uVar24);
          uVar12 = 1;
          uVar18 = (uint)local_90;
          uVar49 = uVar46;
        } while ((uVar18 == 0) ||
                ((((uVar11 | (long)(dVar54 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f) <=
                   uVar46 && (uVar46 <= local_98)) && (uVar12 = (ulong)(uVar18 + 1), uVar18 < 3))));
        bVar4 = bVar2 + 0x10;
        iVar16 = 1 << (bVar2 + 0xf & 0x1f);
        uVar36 = (ulong)(uint)width;
        if (width < 2) {
          uVar36 = 1;
        }
        uVar24 = 1;
        if (1 < height) {
          uVar24 = height;
        }
        uVar38 = 0;
        puVar28 = __ptr;
        piVar50 = __ptr_02;
        do {
          uVar53 = 0;
          do {
            uVar18 = (uint)(uVar53 >> 1) & 0x7fffffff;
            uVar20 = puVar28[uVar53];
            uVar18 = (int)(((int)*(short *)((long)piVar50 + (ulong)((uint)uVar53 & 0xfffffffe)) +
                           (uint)uVar20) * (int)local_d8 + iVar16 +
                           ((int)piVar50[uVar47 + uVar18] + (uint)uVar20) * local_d8._4_4_ +
                          ((int)piVar50[uVar18 + uVar52] + (uint)uVar20) * (int)uStack_d0 + iVar51)
                     >> (bVar4 & 0x1f);
            sVar40 = (short)uVar18;
            if (yuv_bit_depth < 9) {
              uVar17 = (uint)(byte)-(-1 < sVar40);
              if ((uVar18 & 0xffff) < 0x100) {
                uVar17 = uVar18;
              }
              *(char *)((long)local_170 + uVar53) = (char)uVar17;
            }
            else {
              if ((int)uVar41 < (int)sVar40) {
                uVar18 = uVar41;
              }
              uVar42 = (undefined2)uVar18;
              if (sVar40 < 0) {
                uVar42 = 0;
              }
              *(undefined2 *)((long)local_170 + uVar53 * 2) = uVar42;
            }
            uVar53 = uVar53 + 1;
          } while (uVar36 != uVar53);
          piVar50 = piVar50 + (uVar38 & 1) * uVar47 * 3;
          local_170 = (void *)((long)local_170 + (long)y_stride);
          uVar38 = uVar38 + 1;
          puVar28 = (uint16_t *)((long)puVar28 + uVar13);
        } while (uVar38 != uVar24);
        if (uVar47 < 2) {
          uVar19 = 1;
        }
        uVar24 = 1;
        if (1 < uVar44) {
          uVar24 = uVar44;
        }
        lVar22 = uVar13 + (long)__ptr_02;
        piVar50 = __ptr_02 + local_a0;
        uVar47 = 0;
        piVar26 = __ptr_02;
        do {
          uVar36 = 0;
          do {
            iVar51 = (int)*(short *)(lVar22 + uVar36 * 2);
            uVar52 = (int)local_c8 * piVar26[uVar36] + iVar16 +
                     (int)uStack_c0 * iVar51 + local_c8._4_4_ * piVar50[uVar36] + iVar29 >>
                     (bVar4 & 0x1f);
            uVar44 = piVar26[uVar36] * (int)local_b8 + iVar16 +
                     iVar51 * (int)uStack_b0 + piVar50[uVar36] * local_b8._4_4_ + iVar37 >>
                     (bVar4 & 0x1f);
            sVar40 = (short)uVar52;
            sVar43 = (short)uVar44;
            if (yuv_bit_depth < 9) {
              uVar38 = (uint)(byte)-(-1 < sVar40);
              if ((uVar52 & 0xffff) < 0x100) {
                uVar38 = uVar52;
              }
              *(char *)((long)local_160 + uVar36) = (char)uVar38;
              uVar52 = (uint)(byte)-(-1 < sVar43);
              if ((uVar44 & 0xffff) < 0x100) {
                uVar52 = uVar44;
              }
              *(char *)((long)local_168 + uVar36) = (char)uVar52;
            }
            else {
              if ((int)uVar41 < (int)sVar40) {
                uVar52 = uVar41;
              }
              uVar42 = (undefined2)uVar52;
              if (sVar40 < 0) {
                uVar42 = 0;
              }
              *(undefined2 *)((long)local_160 + uVar36 * 2) = uVar42;
              if ((int)uVar41 < (int)sVar43) {
                uVar44 = uVar41;
              }
              uVar42 = (undefined2)uVar44;
              if (sVar43 < 0) {
                uVar42 = 0;
              }
              *(undefined2 *)((long)local_168 + uVar36 * 2) = uVar42;
            }
            uVar36 = uVar36 + 1;
          } while (uVar19 != uVar36);
          local_160 = (void *)((long)local_160 + (long)u_stride);
          local_168 = (void *)((long)local_168 + (long)v_stride);
          uVar47 = uVar47 + 1;
          lVar22 = lVar22 + sVar25;
          piVar50 = piVar50 + uVar30;
          piVar26 = piVar26 + uVar30;
        } while (uVar47 != uVar24);
        iVar10 = 1;
      }
      free(__ptr);
      free(__ptr_02);
      free(__ptr_00);
      free(__ptr_03);
      free(__ptr_01);
      free(dst_01);
      free(dst_00);
    }
  }
  return iVar10;
}

Assistant:

int SharpYuvConvertWithOptions(const void* r_ptr, const void* g_ptr,
                               const void* b_ptr, int rgb_step, int rgb_stride,
                               int rgb_bit_depth, void* y_ptr, int y_stride,
                               void* u_ptr, int u_stride, void* v_ptr,
                               int v_stride, int yuv_bit_depth, int width,
                               int height, const SharpYuvOptions* options) {
  const SharpYuvConversionMatrix* yuv_matrix = options->yuv_matrix;
  SharpYuvTransferFunctionType transfer_type = options->transfer_type;
  SharpYuvConversionMatrix scaled_matrix;
  const int rgb_max = (1 << rgb_bit_depth) - 1;
  const int rgb_round = 1 << (rgb_bit_depth - 1);
  const int yuv_max = (1 << yuv_bit_depth) - 1;
  const int sfix = GetPrecisionShift(rgb_bit_depth);

  if (width < 1 || height < 1 || width == INT_MAX || height == INT_MAX ||
      r_ptr == NULL || g_ptr == NULL || b_ptr == NULL || y_ptr == NULL ||
      u_ptr == NULL || v_ptr == NULL) {
    return 0;
  }
  if (rgb_bit_depth != 8 && rgb_bit_depth != 10 && rgb_bit_depth != 12 &&
      rgb_bit_depth != 16) {
    return 0;
  }
  if (yuv_bit_depth != 8 && yuv_bit_depth != 10 && yuv_bit_depth != 12) {
    return 0;
  }
  if (rgb_bit_depth > 8 && (rgb_step % 2 != 0 || rgb_stride % 2 != 0)) {
    // Step/stride should be even for uint16_t buffers.
    return 0;
  }
  if (yuv_bit_depth > 8 &&
      (y_stride % 2 != 0 || u_stride % 2 != 0 || v_stride % 2 != 0)) {
    // Stride should be even for uint16_t buffers.
    return 0;
  }
  // The address of the function pointer is used to avoid a read race.
  SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);

  // Add scaling factor to go from rgb_bit_depth to yuv_bit_depth, to the
  // rgb->yuv conversion matrix.
  if (rgb_bit_depth == yuv_bit_depth) {
    memcpy(&scaled_matrix, yuv_matrix, sizeof(scaled_matrix));
  } else {
    int i;
    for (i = 0; i < 3; ++i) {
      scaled_matrix.rgb_to_y[i] =
          (yuv_matrix->rgb_to_y[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_u[i] =
          (yuv_matrix->rgb_to_u[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_v[i] =
          (yuv_matrix->rgb_to_v[i] * yuv_max + rgb_round) / rgb_max;
    }
  }
  // Also incorporate precision change scaling.
  scaled_matrix.rgb_to_y[3] = Shift(yuv_matrix->rgb_to_y[3], sfix);
  scaled_matrix.rgb_to_u[3] = Shift(yuv_matrix->rgb_to_u[3], sfix);
  scaled_matrix.rgb_to_v[3] = Shift(yuv_matrix->rgb_to_v[3], sfix);

  return DoSharpArgbToYuv(
      (const uint8_t*)r_ptr, (const uint8_t*)g_ptr, (const uint8_t*)b_ptr,
      rgb_step, rgb_stride, rgb_bit_depth, (uint8_t*)y_ptr, y_stride,
      (uint8_t*)u_ptr, u_stride, (uint8_t*)v_ptr, v_stride, yuv_bit_depth,
      width, height, &scaled_matrix, transfer_type);
}